

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMultiLoad(Vdbe *p,int iDest,char *zTypes,...)

{
  char cVar1;
  int p2;
  char in_AL;
  int *piVar2;
  undefined8 in_RCX;
  ulong uVar3;
  int op;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar4;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  ulong local_58;
  int *piStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_48 = local_108;
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Da;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0x3000000018;
  piStack_50 = (int *)&stack0x00000008;
  lVar4 = 0;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  do {
    cVar1 = zTypes[lVar4];
    p2 = (int)lVar4;
    if (cVar1 == 'i') {
      uVar3 = local_58 & 0xffffffff;
      if (uVar3 < 0x29) {
        local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 8);
        piVar2 = (int *)(local_48 + uVar3);
      }
      else {
        piVar2 = piStack_50;
        piStack_50 = piStack_50 + 2;
      }
      sqlite3VdbeAddOp2(p,0x47,*piVar2,iDest + p2);
    }
    else {
      if (cVar1 != 's') {
        if (cVar1 == '\0') {
          sqlite3VdbeAddOp2(p,0x54,iDest,p2);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return;
        }
        __stack_chk_fail();
      }
      uVar3 = local_58 & 0xffffffff;
      if (uVar3 < 0x29) {
        local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 8);
        piVar2 = (int *)(local_48 + uVar3);
      }
      else {
        piVar2 = piStack_50;
        piStack_50 = piStack_50 + 2;
      }
      op = 0x76;
      if (*(char **)piVar2 == (char *)0x0) {
        op = 0x4b;
      }
      sqlite3VdbeAddOp4(p,op,0,iDest + p2,0,*(char **)piVar2,0);
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMultiLoad(Vdbe *p, int iDest, const char *zTypes, ...){
  va_list ap;
  int i;
  char c;
  va_start(ap, zTypes);
  for(i=0; (c = zTypes[i])!=0; i++){
    if( c=='s' ){
      const char *z = va_arg(ap, const char*);
      sqlite3VdbeAddOp4(p, z==0 ? OP_Null : OP_String8, 0, iDest+i, 0, z, 0);
    }else if( c=='i' ){
      sqlite3VdbeAddOp2(p, OP_Integer, va_arg(ap, int), iDest+i);
    }else{
      goto skip_op_resultrow;
    }
  }
  sqlite3VdbeAddOp2(p, OP_ResultRow, iDest, i);
skip_op_resultrow:
  va_end(ap);
}